

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,4u>>(int bias)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long absDiff;
  ulong uVar6;
  uint recent;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  bool bVar12;
  ulong uVar10;
  
  lVar5 = 0;
  bVar1 = 0;
  uVar6 = 0;
  bVar12 = false;
  do {
    bVar2 = (bVar1 & 0xf) * '\x02';
    uVar9 = (uint)uVar6 & 0xf;
    uVar10 = (ulong)uVar9;
    uVar7 = 0;
    uVar11 = uVar6;
    do {
      if (uVar7 < uVar6) {
        if ((long)uVar11 < (long)(8 - bias)) {
LAB_001027aa:
          uVar8 = (ulong)((uint)uVar7 & 0x10 | uVar9);
          uVar3 = (ulong)((uint)uVar7 & 0xf);
          if (uVar3 < uVar10) {
            uVar4 = uVar8 - 0x10;
            if (uVar10 - uVar3 < 8U - (long)bias) {
              uVar4 = uVar8;
            }
          }
          else {
            uVar4 = uVar8 + 0x10;
            if (uVar3 - uVar10 <= (long)bias + 8U) {
              uVar4 = uVar8;
            }
          }
          if (uVar4 != uVar6) {
            return bVar12;
          }
          if ((bias == 0) &&
             ((((bVar2 >> 4 & 1) << 4) + uVar6) - (ulong)((uint)uVar11 & 0xf) != uVar7)) {
            return bVar12;
          }
        }
      }
      else if ((long)(lVar5 + uVar7) <= (long)(bias + 8)) goto LAB_001027aa;
      uVar7 = uVar7 + 1;
      bVar2 = bVar2 - 2;
      uVar11 = uVar11 - 1;
    } while (uVar7 != 0x20);
    bVar12 = 0x1e < uVar6;
    uVar6 = uVar6 + 1;
    bVar1 = bVar1 + 1;
    lVar5 = lVar5 + -1;
    if (uVar6 == 0x20) {
      return true;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}